

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

void __thiscall cmFileInstaller::~cmFileInstaller(cmFileInstaller *this)

{
  ~cmFileInstaller(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

~cmFileInstaller()
    {
    // Save the updated install manifest.
    this->Makefile->AddDefinition("CMAKE_INSTALL_MANIFEST_FILES",
                                  this->Manifest.c_str());
    }